

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeemitter.cpp
# Opt level: O3

void __thiscall asmjit::CodeEmitter::CodeEmitter(CodeEmitter *this,uint32_t type)

{
  this->_vptr_CodeEmitter = (_func_int **)&PTR__CodeEmitter_001a7a10;
  (this->_codeInfo)._archInfo = (anon_union_4_2_424c626f_for_ArchInfo_0)0x0;
  (this->_codeInfo).field_1 = (anon_union_4_2_314a35c9_for_CodeInfo_1)0x0;
  (this->_codeInfo)._baseAddress = 0xffffffffffffffff;
  this->_code = (CodeHolder *)0x0;
  this->_nextEmitter = (CodeEmitter *)0x0;
  this->_type = (uint8_t)type;
  this->_destroyed = '\0';
  this->_finalized = '\0';
  this->_reserved = '\0';
  this->_lastError = 6;
  this->_privateData = 0;
  this->_globalHints = 0;
  this->_globalOptions = 1;
  *(undefined1 (*) [32])&this->_options = ZEXT832(0) << 0x20;
  *(undefined1 (*) [32])((long)&(this->_none).field_0 + 8) = ZEXT832(0) << 0x20;
  return;
}

Assistant:

CodeEmitter::CodeEmitter(uint32_t type) noexcept
  : _codeInfo(),
    _code(nullptr),
    _nextEmitter(nullptr),
    _type(static_cast<uint8_t>(type)),
    _destroyed(false),
    _finalized(false),
    _reserved(false),
    _lastError(kErrorNotInitialized),
    _privateData(0),
    _globalHints(0),
    _globalOptions(kOptionMaybeFailureCase),
    _options(0),
    _extraReg(),
    _inlineComment(nullptr),
    _none(),
    _nativeGpReg(),
    _nativeGpArray(nullptr) {}